

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O3

Status __thiscall
ot::commissioner::persistent_storage::Registry::GetNetworkByPan
          (Registry *this,string *aPan,Network *aRet)

{
  Status SVar1;
  uint16_t panId;
  Network nwk;
  unsigned_short local_aa;
  Network local_a8;
  Error local_48;
  
  Network::Network(&local_a8);
  local_aa = 0;
  utils::ParseInteger<unsigned_short>(&local_48,&local_aa,aPan);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.mMessage._M_dataplus._M_p != &local_48.mMessage.field_2) {
    operator_delete(local_48.mMessage._M_dataplus._M_p);
  }
  SVar1 = kError;
  if (local_48.mCode == kNone) {
    local_a8.mPan = local_aa;
    SVar1 = LookupOne(this,&local_a8,aRet);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.mMlp._M_dataplus._M_p != &local_a8.mMlp.field_2) {
    operator_delete(local_a8.mMlp._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.mName._M_dataplus._M_p != &local_a8.mName.field_2) {
    operator_delete(local_a8.mName._M_dataplus._M_p);
  }
  return SVar1;
}

Assistant:

Registry::Status Registry::GetNetworkByPan(const std::string &aPan, Network &aRet)
{
    Network  nwk{};
    uint16_t panId = 0;

    if (utils::ParseInteger(panId, aPan).GetCode() != ErrorCode::kNone)
    {
        return Registry::Status::kError;
    }
    nwk.mPan = panId;
    return LookupOne(nwk, aRet);
}